

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void parse_preshader(Context *ctx,uint32 *tokens,uint32 tokcount)

{
  uint32 okay_version;
  uint uVar1;
  MOJOSHADER_malloc p_Var2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  MOJOSHADER_symbol *pMVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  MOJOSHADER_preshader *pMVar16;
  double *pdVar17;
  MOJOSHADER_preshaderInstruction *pMVar18;
  ulong uVar19;
  uint *puVar20;
  float *__s;
  ulong uVar21;
  uint *puVar22;
  char *pcVar23;
  MOJOSHADER_preshaderOpcode MVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  MOJOSHADER_preshaderOperand *pMVar30;
  bool bVar31;
  CtabData ctabdata;
  uint *local_90;
  uint *local_80;
  uint *local_70;
  uint *local_58;
  CtabData local_48;
  
  if (ctx->have_preshader != 0) {
    __assert_fail("ctx->have_preshader == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x29c0,"void parse_preshader(Context *, const uint32 *, uint32)");
  }
  ctx->have_preshader = 1;
  okay_version = *tokens;
  if (okay_version + 0xb9a7fdfe < 0xfffffffe) {
    pcVar23 = "Unsupported preshader version.";
    goto LAB_0010a734;
  }
  uVar28 = tokcount - 1;
  if (uVar28 != 0) {
    puVar22 = tokens + 1;
    local_58 = (uint *)0x0;
    uVar26 = 0;
    bVar4 = false;
    local_70 = (uint *)0x0;
    uVar15 = 0;
    bVar6 = false;
    local_80 = (uint *)0x0;
    uVar29 = 0;
    bVar31 = false;
    local_90 = (uint *)0x0;
    uVar14 = 0;
    bVar5 = false;
    do {
      uVar1 = *puVar22;
      if ((short)uVar1 != -2) {
LAB_0010a65b:
        pcVar23 = "Bogus preshader data.";
        goto LAB_0010a734;
      }
      if ((int)uVar1 < 0) {
        failf(ctx,"%s","comment token high bit must be zero.");
      }
      uVar13 = uVar1 >> 0x10;
      if (uVar28 < uVar13) goto LAB_0010a65b;
      bVar9 = bVar31;
      bVar10 = bVar4;
      bVar11 = bVar5;
      bVar12 = bVar6;
      if (0xffff < uVar1) {
        puVar20 = puVar22 + 1;
        uVar1 = *puVar20;
        if ((int)uVar1 < 0x49535250) {
          if (uVar1 == 0x42415443) {
            local_58 = puVar20;
            bVar10 = true;
            uVar26 = uVar13;
            if (bVar4) {
              pcVar23 = "Multiple CTAB preshader blocks.";
              goto LAB_0010a734;
            }
          }
          else {
            if (uVar1 != 0x434c5846) {
LAB_0010a769:
              pcVar23 = "Bogus preshader section.";
              goto LAB_0010a734;
            }
            local_80 = puVar20;
            bVar9 = true;
            uVar29 = uVar13;
            if (bVar31) {
              pcVar23 = "Multiple FXLC preshader blocks.";
              goto LAB_0010a734;
            }
          }
        }
        else if (uVar1 == 0x49535250) {
          local_70 = puVar20;
          uVar15 = uVar13;
          bVar12 = true;
          if (bVar6) {
            pcVar23 = "Multiple PRSI preshader blocks.";
            goto LAB_0010a734;
          }
        }
        else {
          if (uVar1 != 0x54494c43) goto LAB_0010a769;
          local_90 = puVar20;
          uVar14 = uVar13;
          bVar11 = true;
          if (bVar5) {
            pcVar23 = "Multiple CLIT preshader blocks.";
            goto LAB_0010a734;
          }
        }
      }
      bVar6 = bVar12;
      bVar5 = bVar11;
      bVar4 = bVar10;
      bVar31 = bVar9;
      puVar22 = puVar22 + (ulong)uVar13 + 1;
      uVar28 = uVar28 + ~uVar13;
    } while (uVar28 != 0);
    if (bVar4) {
      if (bVar31) {
        if (bVar5) {
          pMVar16 = (MOJOSHADER_preshader *)(*ctx->malloc)(0x58,ctx->malloc_data);
          if (pMVar16 == (MOJOSHADER_preshader *)0x0) {
            ctx->isfail = 1;
            ctx->out_of_memory = 1;
            return;
          }
          pMVar16->malloc = (MOJOSHADER_malloc)0x0;
          pMVar16->free = (MOJOSHADER_free)0x0;
          *(undefined8 *)&pMVar16->register_count = 0;
          pMVar16->registers = (float *)0x0;
          *(undefined8 *)&pMVar16->instruction_count = 0;
          pMVar16->instructions = (MOJOSHADER_preshaderInstruction *)0x0;
          pMVar16->temp_count = 0;
          pMVar16->symbol_count = 0;
          pMVar16->symbols = (MOJOSHADER_symbol *)0x0;
          *(undefined8 *)pMVar16 = 0;
          pMVar16->literals = (double *)0x0;
          pMVar16->malloc_data = (void *)0x0;
          p_Var2 = ctx->malloc;
          pMVar16->malloc = p_Var2;
          pMVar16->free = ctx->free;
          pvVar3 = ctx->malloc_data;
          pMVar16->malloc_data = pvVar3;
          ctx->preshader = pMVar16;
          if (uVar14 == 0) {
            failf(ctx,"%s","Bogus CLIT block in preshader.");
          }
          else {
            uVar28 = local_90[1];
            if (uVar14 - 2 >> 1 < uVar28) {
              pcVar23 = "Bogus CLIT block in preshader.";
              goto LAB_0010a734;
            }
            if (uVar28 != 0) {
              pMVar16->literal_count = uVar28;
              pdVar17 = (double *)(*p_Var2)(uVar28 * 8,pvVar3);
              if (pdVar17 == (double *)0x0) {
                ctx->isfail = 1;
                ctx->out_of_memory = 1;
                pMVar16->literals = (double *)0x0;
                return;
              }
              pMVar16->literals = pdVar17;
              uVar21 = 0;
              do {
                pdVar17[uVar21] = *(double *)(local_90 + uVar21 * 2 + 2);
                uVar21 = uVar21 + 1;
              } while (uVar28 != uVar21);
            }
          }
          if (bVar6) {
            if ((uVar15 < 8) || (uVar21 = (ulong)local_70[7], uVar15 - 8 < local_70[7] * 2 + 2)) {
              pcVar23 = "Bogus preshader PRSI data";
              goto LAB_0010a734;
            }
            local_70 = local_70 + 8;
          }
          else {
            uVar21 = 0;
            local_70 = (uint *)0x0;
          }
          local_48.have_ctab = 0;
          local_48.symbol_count = 0;
          local_48.symbols = (MOJOSHADER_symbol *)0x0;
          parse_constant_table(ctx,local_58 + -1,uVar26 << 2,okay_version,0,&local_48);
          pMVar8 = local_48.symbols;
          iVar7 = local_48.symbol_count;
          pMVar16->symbol_count = local_48.symbol_count;
          pMVar16->symbols = local_48.symbols;
          if (local_48.have_ctab == 0) {
            pcVar23 = "Bogus preshader CTAB data";
          }
          else {
            uVar28 = local_80[1];
            uVar27 = (ulong)uVar28;
            pMVar16->instruction_count = uVar28;
            pMVar18 = (MOJOSHADER_preshaderInstruction *)
                      (*ctx->malloc)((int)(uVar27 * 0x70),ctx->malloc_data);
            if (pMVar18 == (MOJOSHADER_preshaderInstruction *)0x0) {
              ctx->isfail = 1;
              ctx->out_of_memory = 1;
              pMVar16->instructions = (MOJOSHADER_preshaderInstruction *)0x0;
              return;
            }
            uVar29 = uVar29 - 2;
            pMVar16->instructions = pMVar18;
            memset(pMVar18,0,uVar27 * 0x70);
            if (uVar28 <= uVar29 >> 1) {
              if (uVar28 != 0) {
                pMVar18 = pMVar16->instructions;
                local_80 = local_80 + 2;
                do {
                  uVar28 = *local_80;
                  uVar14 = uVar28 >> 0x10;
                  if (uVar14 < 0x2050) {
                    if (uVar14 < 0x1090) {
                      if (uVar14 < 0x1050) {
                        if (uVar14 < 0x1030) {
                          MVar24 = MOJOSHADER_PRESHADEROP_MOV;
                          if (uVar14 != 0x1000) {
                            if (uVar14 != 0x1010) goto LAB_0010acf9;
                            MVar24 = MOJOSHADER_PRESHADEROP_NEG;
                          }
                        }
                        else if (uVar14 == 0x1030) {
                          MVar24 = MOJOSHADER_PRESHADEROP_RCP;
                        }
                        else {
                          if (uVar14 != 0x1040) goto LAB_0010acf9;
                          MVar24 = MOJOSHADER_PRESHADEROP_FRC;
                        }
                      }
                      else if (uVar14 < 0x1070) {
                        if (uVar14 == 0x1050) {
                          MVar24 = MOJOSHADER_PRESHADEROP_EXP;
                        }
                        else {
                          if (uVar14 != 0x1060) goto LAB_0010acf9;
                          MVar24 = MOJOSHADER_PRESHADEROP_LOG;
                        }
                      }
                      else if (uVar14 == 0x1070) {
                        MVar24 = MOJOSHADER_PRESHADEROP_RSQ;
                      }
                      else {
                        if (uVar14 != 0x1080) goto LAB_0010acf9;
                        MVar24 = MOJOSHADER_PRESHADEROP_SIN;
                      }
                    }
                    else if (uVar14 < 0x2000) {
                      if (uVar14 < 0x10b0) {
                        if (uVar14 == 0x1090) {
                          MVar24 = MOJOSHADER_PRESHADEROP_COS;
                        }
                        else if (uVar14 == 0x10a0) {
                          MVar24 = MOJOSHADER_PRESHADEROP_ASIN;
                        }
                        else {
LAB_0010acf9:
                          MVar24 = MOJOSHADER_PRESHADEROP_NOP;
                          failf(ctx,"%s","Unknown preshader opcode.");
                        }
                      }
                      else if (uVar14 == 0x10b0) {
                        MVar24 = MOJOSHADER_PRESHADEROP_ACOS;
                      }
                      else {
                        if (uVar14 != 0x10c0) goto LAB_0010acf9;
                        MVar24 = MOJOSHADER_PRESHADEROP_ATAN;
                      }
                    }
                    else if (uVar14 < 0x2020) {
                      if (uVar14 == 0x2000) {
                        MVar24 = MOJOSHADER_PRESHADEROP_MIN;
                      }
                      else {
                        if (uVar14 != 0x2010) goto LAB_0010acf9;
                        MVar24 = MOJOSHADER_PRESHADEROP_MAX;
                      }
                    }
                    else if (uVar14 == 0x2020) {
                      MVar24 = MOJOSHADER_PRESHADEROP_LT;
                    }
                    else if (uVar14 == 0x2030) {
                      MVar24 = MOJOSHADER_PRESHADEROP_GE;
                    }
                    else {
                      if (uVar14 != 0x2040) goto LAB_0010acf9;
                      MVar24 = MOJOSHADER_PRESHADEROP_ADD;
                    }
                  }
                  else if (uVar14 < 0xa010) {
                    if (uVar14 < 0x3010) {
                      if (uVar14 < 0x2080) {
                        if (uVar14 == 0x2050) {
                          MVar24 = MOJOSHADER_PRESHADEROP_MUL;
                        }
                        else {
                          if (uVar14 != 0x2060) goto LAB_0010acf9;
                          MVar24 = MOJOSHADER_PRESHADEROP_ATAN2;
                        }
                      }
                      else if (uVar14 == 0x2080) {
                        MVar24 = MOJOSHADER_PRESHADEROP_DIV;
                      }
                      else {
                        if (uVar14 != 0x3000) goto LAB_0010acf9;
                        MVar24 = MOJOSHADER_PRESHADEROP_CMP;
                      }
                    }
                    else if (uVar14 < 0x5020) {
                      if (uVar14 == 0x3010) {
                        MVar24 = MOJOSHADER_PRESHADEROP_MOVC;
                      }
                      else {
                        if (uVar14 != 0x5000) goto LAB_0010acf9;
                        MVar24 = MOJOSHADER_PRESHADEROP_DOT;
                      }
                    }
                    else if (uVar14 == 0x5020) {
                      MVar24 = MOJOSHADER_PRESHADEROP_NOISE;
                    }
                    else {
                      if (uVar14 != 0xa000) goto LAB_0010acf9;
                      MVar24 = MOJOSHADER_PRESHADEROP_MIN_SCALAR;
                    }
                  }
                  else if (uVar14 < 0xa050) {
                    if (uVar14 < 0xa030) {
                      if (uVar14 == 0xa010) {
                        MVar24 = MOJOSHADER_PRESHADEROP_MAX_SCALAR;
                      }
                      else {
                        if (uVar14 != 0xa020) goto LAB_0010acf9;
                        MVar24 = MOJOSHADER_PRESHADEROP_LT_SCALAR;
                      }
                    }
                    else if (uVar14 == 0xa030) {
                      MVar24 = MOJOSHADER_PRESHADEROP_GE_SCALAR;
                    }
                    else {
                      if (uVar14 != 0xa040) goto LAB_0010acf9;
                      MVar24 = MOJOSHADER_PRESHADEROP_ADD_SCALAR;
                    }
                  }
                  else if (uVar14 < 0xa080) {
                    if (uVar14 == 0xa050) {
                      MVar24 = MOJOSHADER_PRESHADEROP_MUL_SCALAR;
                    }
                    else {
                      if (uVar14 != 0xa060) goto LAB_0010acf9;
                      MVar24 = MOJOSHADER_PRESHADEROP_ATAN2_SCALAR;
                    }
                  }
                  else if (uVar14 == 0xa080) {
                    MVar24 = MOJOSHADER_PRESHADEROP_DIV_SCALAR;
                  }
                  else if (uVar14 == 0xd000) {
                    MVar24 = MOJOSHADER_PRESHADEROP_DOT_SCALAR;
                  }
                  else {
                    if (uVar14 != 0xd020) goto LAB_0010acf9;
                    MVar24 = MOJOSHADER_PRESHADEROP_NOISE_SCALAR;
                  }
                  uVar26 = local_80[1];
                  uVar14 = uVar26 + 1;
                  pMVar18->opcode = MVar24;
                  pMVar18->element_count = uVar28 & 0xff;
                  pMVar18->operand_count = uVar14;
                  uVar29 = uVar29 - 2;
                  if (uVar29 < uVar14 * 3) {
                    pcVar23 = "Bogus preshader FXLC block.";
                    goto LAB_0010a92a;
                  }
                  local_80 = local_80 + 2;
                  if (uVar14 != 0) {
                    pMVar30 = pMVar18->operands;
                    do {
                      uVar28 = local_80[2];
                      puVar22 = local_80;
                      switch(local_80[1]) {
                      case 1:
                        if (pMVar16->literal_count < uVar28) {
                          pcVar23 = "Bogus preshader literal index.";
LAB_0010aecc:
                          failf(ctx,"%s",pcVar23);
                        }
                        else {
                          pMVar30->type = MOJOSHADER_PRESHADEROPERAND_LITERAL;
                        }
                        break;
                      case 2:
                        uVar14 = *local_80;
                        uVar15 = 0;
                        puVar20 = &pMVar8->register_count;
                        if (iVar7 == 0) {
LAB_0010ae65:
                          if (uVar15 != iVar7) {
                            pMVar30->type = MOJOSHADER_PRESHADEROPERAND_INPUT;
                            if (uVar14 != 0) {
                              pMVar30->array_register_count = uVar14;
                              puVar20 = (uint *)(*ctx->malloc)(uVar14 * 4,ctx->malloc_data);
                              if (puVar20 == (uint *)0x0) {
                                ctx->isfail = 1;
                                ctx->out_of_memory = 1;
                              }
                              pMVar30->array_registers = puVar20;
                              memset(puVar20,0,(ulong)(uVar14 * 4));
                              puVar20 = pMVar30->array_registers;
                              uVar25 = 0;
                              do {
                                puVar20[uVar25] = local_80[uVar25 * 2 + 4] >> 2;
                                puVar22 = puVar22 + 2;
                                uVar25 = uVar25 + 1;
                              } while (uVar14 != uVar25);
                              uVar29 = uVar29 + uVar14 * -2;
                            }
                            break;
                          }
                        }
                        else {
                          do {
                            if (puVar20[-2] != MOJOSHADER_SYMREGSET_FLOAT4) {
                              __assert_fail("sym->register_set==MOJOSHADER_SYMREGSET_FLOAT4",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                                            ,0x2ac8,
                                            "void parse_preshader(Context *, const uint32 *, uint32)"
                                           );
                            }
                            if ((puVar20[-1] * 4 <= uVar28) &&
                               (uVar28 < (puVar20[-1] + *puVar20) * 4)) goto LAB_0010ae65;
                            uVar15 = uVar15 + 1;
                            puVar20 = puVar20 + 0xe;
                          } while (iVar7 != uVar15);
                        }
                        failf(ctx,"%s","Bogus preshader input index.");
                        break;
                      case 4:
                        pMVar30->type = MOJOSHADER_PRESHADEROPERAND_OUTPUT;
                        if (uVar21 == 0) {
                          uVar25 = 0;
                        }
                        else {
                          uVar14 = 1;
                          uVar19 = 0;
                          do {
                            if ((local_70[uVar14 - 1] * 4 <= uVar28) &&
                               (uVar25 = uVar19,
                               uVar28 < (local_70[uVar14 - 1] + local_70[uVar14]) * 4)) break;
                            uVar19 = uVar19 + 1;
                            uVar14 = uVar14 + 2;
                            uVar25 = uVar21;
                          } while (uVar21 != uVar19);
                        }
                        if ((bVar6) && ((int)uVar25 == (int)uVar21)) {
                          pcVar23 = "Bogus preshader output index.";
                          goto LAB_0010aecc;
                        }
                        break;
                      case 7:
                        pMVar30->type = MOJOSHADER_PRESHADEROPERAND_TEMP;
                        if (pMVar16->temp_count <= uVar28) {
                          pMVar16->temp_count = uVar28 + 1;
                        }
                      }
                      pMVar30->index = uVar28;
                      local_80 = puVar22 + 3;
                      uVar29 = uVar29 - 3;
                      pMVar30 = pMVar30 + 1;
                      bVar31 = uVar26 != 0;
                      uVar26 = uVar26 - 1;
                    } while (bVar31);
                  }
                  uVar28 = (int)uVar27 - 1;
                  uVar27 = (ulong)uVar28;
                  pMVar18 = pMVar18 + 1;
                } while (uVar28 != 0);
              }
              uVar28 = pMVar16->symbol_count;
              pMVar16->temp_count = pMVar16->temp_count + 3 & 0xfffffffc;
              if (uVar28 == 0) {
                return;
              }
              puVar22 = &pMVar16->symbols->register_count;
              uVar29 = 0;
              do {
                uVar14 = *puVar22 + puVar22[-1];
                if (*puVar22 + puVar22[-1] <= uVar29) {
                  uVar14 = uVar29;
                }
                uVar29 = uVar14;
                puVar22 = puVar22 + 0xe;
                uVar28 = uVar28 - 1;
              } while (uVar28 != 0);
              if (uVar29 == 0) {
                return;
              }
              __s = (float *)(*ctx->malloc)((int)((ulong)uVar29 << 4),ctx->malloc_data);
              if (__s == (float *)0x0) {
                ctx->isfail = 1;
                ctx->out_of_memory = 1;
              }
              pMVar16->registers = __s;
              memset(__s,0,(ulong)uVar29 << 4);
              pMVar16->register_count = uVar29;
              return;
            }
            pcVar23 = "Bogus preshader FXLC block.";
          }
LAB_0010a92a:
          failf(ctx,"%s",pcVar23);
          return;
        }
        pcVar23 = "No CLIT block in preshader.";
      }
      else {
        pcVar23 = "No FXLC block in preshader.";
      }
      goto LAB_0010a734;
    }
  }
  pcVar23 = "No CTAB block in preshader.";
LAB_0010a734:
  failf(ctx,"%s",pcVar23);
  return;
}

Assistant:

static void parse_preshader(Context *ctx, const uint32 *tokens, uint32 tokcount)
{
#ifndef MOJOSHADER_EFFECT_SUPPORT
    fail(ctx, "Preshader found, but effect support is disabled!");
#else
    uint32 i;

    assert(ctx->have_preshader == 0);  // !!! FIXME: can you have more than one?
    ctx->have_preshader = 1;

    // !!! FIXME: I don't know what specific versions signify, but we need to
    // !!! FIXME:  save this to test against the CTAB version field, if
    // !!! FIXME:  nothing else.
    // !!! FIXME: 0x02 0x0? is probably the version (fx_2_?),
    // !!! FIXME:  and 0x4658 is the magic, like a real shader's version token.
    const uint32 version_magic = 0x46580000;
    const uint32 min_version = 0x00000200 | version_magic;
    const uint32 max_version = 0x00000201 | version_magic;
    const uint32 version = SWAP32(tokens[0]);
    if (version < min_version || version > max_version)
    {
        fail(ctx, "Unsupported preshader version.");
        return;  // fail because the shader will malfunction w/o this.
    } // if

    tokens++;
    tokcount--;

    // All sections of a preshader are packed into separate comment tokens,
    //  inside the containing comment token block. Find them all before
    //  we start, so we don't care about the order they appear in the file.
    PreshaderBlockInfo ctab = { 0, 0, 0 };
    PreshaderBlockInfo prsi = { 0, 0, 0 };
    PreshaderBlockInfo fxlc = { 0, 0, 0 };
    PreshaderBlockInfo clit = { 0, 0, 0 };

    while (tokcount > 0)
    {
        uint32 subtokcount = 0;
        if ( (!is_comment_token(ctx, *tokens, &subtokcount)) ||
             (subtokcount > tokcount) )
        {
            fail(ctx, "Bogus preshader data.");
            return;
        } // if

        tokens++;
        tokcount--;

        const uint32 *nexttokens = tokens + subtokcount;
        const uint32 nexttokcount = tokcount - subtokcount;

        if (subtokcount > 0)
        {
            switch (SWAP32(*tokens))
            {
                #define PRESHADER_BLOCK_CASE(id, var) \
                    case id##_ID: { \
                        if (var.seen) { \
                            fail(ctx, "Multiple " #id " preshader blocks."); \
                            return; \
                        } \
                        var.tokens = tokens; \
                        var.tokcount = subtokcount; \
                        var.seen = 1; \
                        break; \
                    }
                PRESHADER_BLOCK_CASE(CTAB, ctab);
                PRESHADER_BLOCK_CASE(PRSI, prsi);
                PRESHADER_BLOCK_CASE(FXLC, fxlc);
                PRESHADER_BLOCK_CASE(CLIT, clit);
                default: fail(ctx, "Bogus preshader section."); return;
                #undef PRESHADER_BLOCK_CASE
            } // switch
        } // if

        tokens = nexttokens;
        tokcount = nexttokcount;
    } // while

    if (!ctab.seen) { fail(ctx, "No CTAB block in preshader."); return; }
    if (!fxlc.seen) { fail(ctx, "No FXLC block in preshader."); return; }
    if (!clit.seen) { fail(ctx, "No CLIT block in preshader."); return; }
    // prsi.seen is optional, apparently.

    MOJOSHADER_preshader *preshader = (MOJOSHADER_preshader *)
                                    Malloc(ctx, sizeof (MOJOSHADER_preshader));
    if (preshader == NULL)
        return;

    memset(preshader, '\0', sizeof (MOJOSHADER_preshader));
    preshader->malloc = ctx->malloc;
    preshader->free = ctx->free;
    preshader->malloc_data = ctx->malloc_data;

    ctx->preshader = preshader;

    // Let's set up the constant literals first...
    if (clit.tokcount == 0)
        fail(ctx, "Bogus CLIT block in preshader.");
    else
    {
        const uint32 lit_count = SWAP32(clit.tokens[1]);
        if (lit_count > ((clit.tokcount - 2) / 2))
        {
            fail(ctx, "Bogus CLIT block in preshader.");
            return;
        } // if
        else if (lit_count > 0)
        {
            preshader->literal_count = (unsigned int) lit_count;
            assert(sizeof (double) == 8);  // just in case.
            const size_t len = sizeof (double) * lit_count;
            preshader->literals = (double *) Malloc(ctx, len);
            if (preshader->literals == NULL)
                return;  // oh well.
            const double *litptr = (const double *) (clit.tokens + 2);
            for (i = 0; i < lit_count; i++)
                preshader->literals[i] = SWAPDBL(litptr[i]);
        } // else if
    } // else

    // Parse out the PRSI block. This is used to map the output registers.
    uint32 output_map_count = 0;
    const uint32 *output_map = NULL;
    if (prsi.seen)
    {
        if (prsi.tokcount < 8)
        {
            fail(ctx, "Bogus preshader PRSI data");
            return;
        } // if

        //const uint32 first_output_reg = SWAP32(prsi.tokens[1]);
        // !!! FIXME: there are a lot of fields here I don't know about.
        // !!! FIXME:  maybe [2] and [3] are for int4 and bool registers?
        //const uint32 output_reg_count = SWAP32(prsi.tokens[4]);
        // !!! FIXME:  maybe [5] and [6] are for int4 and bool registers?
        output_map_count = SWAP32(prsi.tokens[7]);

        prsi.tokcount -= 8;
        prsi.tokens += 8;

        if (prsi.tokcount < ((output_map_count + 1) * 2))
        {
            fail(ctx, "Bogus preshader PRSI data");
            return;
        } // if

        output_map = prsi.tokens;
    } // if

    // Now we'll figure out the CTAB...
    CtabData ctabdata = { 0, 0, 0 };
    parse_constant_table(ctx, ctab.tokens - 1, ctab.tokcount * 4,
                         version, 0, &ctabdata);

    // preshader owns this now. Don't free it in this function.
    preshader->symbol_count = ctabdata.symbol_count;
    preshader->symbols = ctabdata.symbols;

    if (!ctabdata.have_ctab)
    {
        fail(ctx, "Bogus preshader CTAB data");
        return;
    } // if

    // The FXLC block has the actual instructions...
    uint32 opcode_count = SWAP32(fxlc.tokens[1]);

    const size_t len = sizeof (MOJOSHADER_preshaderInstruction) * opcode_count;
    preshader->instruction_count = (unsigned int) opcode_count;
    preshader->instructions = (MOJOSHADER_preshaderInstruction *) Malloc(ctx, len);
    if (preshader->instructions == NULL)
        return;
    memset(preshader->instructions, '\0', len);

    fxlc.tokens += 2;
    fxlc.tokcount -= 2;
    if (opcode_count > (fxlc.tokcount / 2))
    {
        fail(ctx, "Bogus preshader FXLC block.");
        return;
    } // if

    MOJOSHADER_preshaderInstruction *inst = preshader->instructions;
    while (opcode_count--)
    {
        const uint32 opcodetok = SWAP32(fxlc.tokens[0]);
        MOJOSHADER_preshaderOpcode opcode = MOJOSHADER_PRESHADEROP_NOP;
        switch ((opcodetok >> 16) & 0xFFFF)
        {
            case 0x1000: opcode = MOJOSHADER_PRESHADEROP_MOV; break;
            case 0x1010: opcode = MOJOSHADER_PRESHADEROP_NEG; break;
            case 0x1030: opcode = MOJOSHADER_PRESHADEROP_RCP; break;
            case 0x1040: opcode = MOJOSHADER_PRESHADEROP_FRC; break;
            case 0x1050: opcode = MOJOSHADER_PRESHADEROP_EXP; break;
            case 0x1060: opcode = MOJOSHADER_PRESHADEROP_LOG; break;
            case 0x1070: opcode = MOJOSHADER_PRESHADEROP_RSQ; break;
            case 0x1080: opcode = MOJOSHADER_PRESHADEROP_SIN; break;
            case 0x1090: opcode = MOJOSHADER_PRESHADEROP_COS; break;
            case 0x10A0: opcode = MOJOSHADER_PRESHADEROP_ASIN; break;
            case 0x10B0: opcode = MOJOSHADER_PRESHADEROP_ACOS; break;
            case 0x10C0: opcode = MOJOSHADER_PRESHADEROP_ATAN; break;
            case 0x2000: opcode = MOJOSHADER_PRESHADEROP_MIN; break;
            case 0x2010: opcode = MOJOSHADER_PRESHADEROP_MAX; break;
            case 0x2020: opcode = MOJOSHADER_PRESHADEROP_LT; break;
            case 0x2030: opcode = MOJOSHADER_PRESHADEROP_GE; break;
            case 0x2040: opcode = MOJOSHADER_PRESHADEROP_ADD; break;
            case 0x2050: opcode = MOJOSHADER_PRESHADEROP_MUL; break;
            case 0x2060: opcode = MOJOSHADER_PRESHADEROP_ATAN2; break;
            case 0x2080: opcode = MOJOSHADER_PRESHADEROP_DIV; break;
            case 0x3000: opcode = MOJOSHADER_PRESHADEROP_CMP; break;
            case 0x3010: opcode = MOJOSHADER_PRESHADEROP_MOVC; break;
            case 0x5000: opcode = MOJOSHADER_PRESHADEROP_DOT; break;
            case 0x5020: opcode = MOJOSHADER_PRESHADEROP_NOISE; break;
            case 0xA000: opcode = MOJOSHADER_PRESHADEROP_MIN_SCALAR; break;
            case 0xA010: opcode = MOJOSHADER_PRESHADEROP_MAX_SCALAR; break;
            case 0xA020: opcode = MOJOSHADER_PRESHADEROP_LT_SCALAR; break;
            case 0xA030: opcode = MOJOSHADER_PRESHADEROP_GE_SCALAR; break;
            case 0xA040: opcode = MOJOSHADER_PRESHADEROP_ADD_SCALAR; break;
            case 0xA050: opcode = MOJOSHADER_PRESHADEROP_MUL_SCALAR; break;
            case 0xA060: opcode = MOJOSHADER_PRESHADEROP_ATAN2_SCALAR; break;
            case 0xA080: opcode = MOJOSHADER_PRESHADEROP_DIV_SCALAR; break;
            case 0xD000: opcode = MOJOSHADER_PRESHADEROP_DOT_SCALAR; break;
            case 0xD020: opcode = MOJOSHADER_PRESHADEROP_NOISE_SCALAR; break;
            default: fail(ctx, "Unknown preshader opcode."); break;
        } // switch

        uint32 operand_count = SWAP32(fxlc.tokens[1]) + 1;  // +1 for dest.

        inst->opcode = opcode;
        inst->element_count = (unsigned int) (opcodetok & 0xFF);
        inst->operand_count = (unsigned int) operand_count;

        fxlc.tokens += 2;
        fxlc.tokcount -= 2;
        if ((operand_count * 3) > fxlc.tokcount)
        {
            fail(ctx, "Bogus preshader FXLC block.");
            return;
        } // if

        MOJOSHADER_preshaderOperand *operand = inst->operands;
        while (operand_count--)
        {
            const unsigned int item = (unsigned int) SWAP32(fxlc.tokens[2]);

            // !!! FIXME: Is this used anywhere other than INPUT? -flibit
            const uint32 numarrays = SWAP32(fxlc.tokens[0]);
            switch (SWAP32(fxlc.tokens[1]))
            {
                case 1:  // literal from CLIT block.
                {
                    if (item > preshader->literal_count)
                    {
                        fail(ctx, "Bogus preshader literal index.");
                        break;
                    } // if
                    operand->type = MOJOSHADER_PRESHADEROPERAND_LITERAL;
                    break;
                } // case

                case 2:  // item from ctabdata.
                {
                    MOJOSHADER_symbol *sym = ctabdata.symbols;
                    const uint32 symcount = (uint32) ctabdata.symbol_count;
                    for (i = 0; i < symcount; i++, sym++)
                    {
                        const uint32 base = sym->register_index * 4;
                        const uint32 count = sym->register_count * 4;
                        assert(sym->register_set==MOJOSHADER_SYMREGSET_FLOAT4);
                        if ( (base <= item) && ((base + count) > item) )
                            break;
                    } // for
                    if (i == ctabdata.symbol_count)
                    {
                        fail(ctx, "Bogus preshader input index.");
                        break;
                    } // if
                    operand->type = MOJOSHADER_PRESHADEROPERAND_INPUT;
                    if (numarrays > 0)
                    {
                        // malloc the array symbol name array
                        const uint32 siz = numarrays * sizeof (uint32);
                        operand->array_register_count = numarrays;
                        operand->array_registers = (uint32 *) Malloc(ctx, siz);
                        memset(operand->array_registers, '\0', siz);
                        // Get each register base, indicating the arrays used.
                        // !!! FIXME: fail if fxlc.tokcount*2 > numarrays ?
                        for (i = 0; i < numarrays; i++)
                        {
                            const uint32 jmp = SWAP32(fxlc.tokens[4]);
                            const uint32 bigjmp = (jmp >> 4) * 4;
                            const uint32 ltljmp = (jmp >> 2) & 3;
                            operand->array_registers[i] = bigjmp + ltljmp;
                            fxlc.tokens += 2;
                            fxlc.tokcount -= 2;
                        } // for
                    } // if
                    break;
                } // case

                case 4:
                {
                    operand->type = MOJOSHADER_PRESHADEROPERAND_OUTPUT;

                    for (i = 0; i < output_map_count; i++)
                    {
                        const uint32 base = output_map[(i*2)] * 4;
                        const uint32 count = output_map[(i*2)+1] * 4;
                        if ( (base <= item) && ((base + count) > item) )
                            break;
                    } // for

                    if (i == output_map_count)
                    {
                        if (prsi.seen)  // No PRSI tokens, no output map.
                            fail(ctx, "Bogus preshader output index.");
                    } // if

                    break;
                } // case

                case 7:
                {
                    operand->type = MOJOSHADER_PRESHADEROPERAND_TEMP;
                    if (item >= preshader->temp_count)
                        preshader->temp_count = item + 1;
                    break;
                } // case
            } // switch

            operand->index = item;

            fxlc.tokens += 3;
            fxlc.tokcount -= 3;
            operand++;
        } // while

        inst++;
    } // while

    // Registers need to be vec4, round up to nearest 4
    preshader->temp_count = (preshader->temp_count + 3) & ~3;

    unsigned int largest = 0;
    const MOJOSHADER_symbol *sym = preshader->symbols;
    const uint32 symcount = (uint32) preshader->symbol_count;
    for (i = 0; i < symcount; i++, sym++)
    {
        const unsigned int val = sym->register_index + sym->register_count;
        if (val > largest)
            largest = val;
    } // for

    if (largest > 0)
    {
        const size_t len = largest * sizeof (float) * 4;
        preshader->registers = (float *) Malloc(ctx, len);
        memset(preshader->registers, '\0', len);
        preshader->register_count = largest;
    } // if
#endif
}